

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O2

void write_action_result_type(Context *ctx,Var obj,PropertyId id,Script *script,ActionPtr *action)

{
  Action *pAVar1;
  pointer pTVar2;
  pointer pTVar3;
  string_view name;
  string_view name_00;
  Module *this;
  Var value;
  Export *pEVar4;
  Func *pFVar5;
  Var pvVar6;
  Global *pGVar7;
  ulong uVar8;
  
  this = wabt::Script::GetModule
                   (script,&((action->_M_t).
                             super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>
                             .super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl)->module_var
                   );
  value = (*ctx->chakra->spec->createArray)(ctx->chakra->user_data);
  set_property(ctx,obj,id,value,"Unable to set action result type");
  pAVar1 = (action->_M_t).super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
           _M_t.super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
           super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
  if (pAVar1->type_ == Get) {
    name_00.data_ = (pAVar1->name)._M_dataplus._M_p;
    name_00.size_ = (pAVar1->name)._M_string_length;
    pEVar4 = wabt::Module::GetExport(this,name_00);
    if (pEVar4->kind == Global) {
      pGVar7 = wabt::Module::GetGlobal(this,&pEVar4->var);
      pvVar6 = create_type_object(ctx,pGVar7->type);
      (*ctx->chakra->spec->push)(value,pvVar6,ctx->chakra->user_data);
      return;
    }
    __assert_fail("export_->kind == ExternalKind::Global",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                  ,0xf8,
                  "void write_action_result_type(Context *, Js::Var, PropertyId, Script *, const ActionPtr &)"
                 );
  }
  if (pAVar1->type_ == Invoke) {
    name.data_ = (pAVar1->name)._M_dataplus._M_p;
    name.size_ = (pAVar1->name)._M_string_length;
    pEVar4 = wabt::Module::GetExport(this,name);
    if (pEVar4->kind != First) {
      __assert_fail("export_->kind == ExternalKind::Func",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                    ,0xe9,
                    "void write_action_result_type(Context *, Js::Var, PropertyId, Script *, const ActionPtr &)"
                   );
    }
    pFVar5 = wabt::Module::GetFunc(this,&pEVar4->var);
    pTVar2 = (pFVar5->decl).sig.result_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pTVar3 = (pFVar5->decl).sig.result_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar8 = 0; ((ulong)((long)pTVar2 - (long)pTVar3) >> 2 & 0xffffffff) != uVar8;
        uVar8 = uVar8 + 1) {
      pvVar6 = create_type_object(ctx,(pFVar5->decl).sig.result_types.
                                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                      _M_impl.super__Vector_impl_data._M_start[uVar8]);
      (*ctx->chakra->spec->push)(value,pvVar6,ctx->chakra->user_data);
    }
  }
  return;
}

Assistant:

void write_action_result_type(Context* ctx, Js::Var obj, PropertyId id, Script* script, const ActionPtr& action)
{
    const Module* module = script->GetModule(action->module_var);
    const Export* export_;
    Js::Var resultArr = ctx->chakra->spec->createArray(ctx->chakra->user_data);
    set_property(ctx, obj, id, resultArr, "Unable to set action result type");

    switch (action->type())
    {
    case ActionType::Invoke:
    {
        export_ = module->GetExport(action->name);
        assert(export_->kind == ExternalKind::Func);
        const Func* func = module->GetFunc(export_->var);
        wabt::Index num_results = func->GetNumResults();
        wabt::Index i;
        for (i = 0; i < num_results; ++i)
        {
            Js::Var typeObj = create_type_object(ctx, func->GetResultType(i));
            ctx->chakra->spec->push(resultArr, typeObj, ctx->chakra->user_data);
        }
        break;
    }

    case ActionType::Get:
    {
        export_ = module->GetExport(action->name);
        assert(export_->kind == ExternalKind::Global);
        const Global* global = module->GetGlobal(export_->var);
        Js::Var typeObj = create_type_object(ctx, global->type);
        ctx->chakra->spec->push(resultArr, typeObj, ctx->chakra->user_data);
        break;
    }
    }
}